

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

unsigned_short duckdb::Cast::Operation<duckdb::timestamp_ms_t,unsigned_short>(timestamp_ms_t input)

{
  bool bVar1;
  string *msg;
  unsigned_short *in_RDI;
  timestamp_ms_t unaff_retaddr;
  unsigned_short result;
  timestamp_ms_t in_stack_000001a8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffb4;
  unsigned_short in_stack_fffffffffffffff6;
  
  bVar1 = TryCast::Operation<duckdb::timestamp_ms_t,unsigned_short>
                    (unaff_retaddr,in_RDI,SUB21(in_stack_fffffffffffffff6 >> 8,0));
  if (!bVar1) {
    uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffffb0);
    msg = (string *)__cxa_allocate_exception(0x10);
    CastExceptionText<duckdb::timestamp_ms_t,unsigned_short>(in_stack_000001a8);
    InvalidInputException::InvalidInputException
              ((InvalidInputException *)CONCAT44(in_stack_ffffffffffffffb4,uVar2),msg);
    __cxa_throw(msg,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException);
  }
  return in_stack_fffffffffffffff6;
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}